

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcaches_flush(tsd_t *tsd,uint ind)

{
  tcaches_t tcache;
  int iVar1;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  if (iVar1 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&tcaches_mtx);
  }
  tcaches_mtx.field_0.field_0.prof_data.n_lock_ops =
       tcaches_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(tcaches_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    tcaches_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(tcaches_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    tcaches_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  tcache.field_0 = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[ind].field_0.tcache;
  if ((tcache.field_0 != (tcache_t *)0x0) &&
     (duckdb_je_tcaches[ind].field_0 = (anon_union_8_2_150e8edc_for_tcaches_s_0)0x1,
     tcache.field_0 != (tcache_t *)&DAT_00000001)) {
    tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
    tcache_destroy(tsd,(tcache_t *)tcache.field_0,false);
    return;
  }
  tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  return;
}

Assistant:

void
tcaches_flush(tsd_t *tsd, unsigned ind) {
	malloc_mutex_lock(tsd_tsdn(tsd), &tcaches_mtx);
	tcache_t *tcache = tcaches_elm_remove(tsd, &tcaches[ind], true);
	malloc_mutex_unlock(tsd_tsdn(tsd), &tcaches_mtx);
	if (tcache != NULL) {
		/* Destroy the tcache; recreate in tcaches_get() if needed. */
		tcache_destroy(tsd, tcache, false);
	}
}